

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkRenderingAttachmentLocationInfoKHR *info)

{
  uint local_24;
  uint32_t i;
  VkRenderingAttachmentLocationInfoKHR *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->colorAttachmentCount);
  if (info->pColorAttachmentLocations == (uint32_t *)0x0) {
    Hasher::u32(h,0);
  }
  else {
    for (local_24 = 0; local_24 < info->colorAttachmentCount; local_24 = local_24 + 1) {
      Hasher::u32(h,info->pColorAttachmentLocations[local_24]);
    }
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *, Hasher &h,
                              const VkRenderingAttachmentLocationInfoKHR &info)
{
	h.u32(info.colorAttachmentCount);
	if (info.pColorAttachmentLocations)
	{
		for (uint32_t i = 0; i < info.colorAttachmentCount; i++)
			h.u32(info.pColorAttachmentLocations[i]);
	}
	else
		h.u32(0);
}